

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void * ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,void *ptr,ZSTD_compressionParameters *cParams,
                 ZSTD_compResetPolicy_e crp,U32 forCCtx)

{
  U32 *pUVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long local_40;
  
  if (cParams->strategy == ZSTD_fast) {
    local_40 = 0;
  }
  else {
    local_40 = 1L << ((byte)cParams->chainLog & 0x3f);
  }
  lVar3 = 1L << ((byte)cParams->hashLog & 0x3f);
  uVar2 = 0;
  if ((forCCtx != 0) && (cParams->searchLength == 3)) {
    uVar2 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar2 = cParams->windowLog;
    }
  }
  lVar4 = 1L << ((byte)uVar2 & 0x3f);
  ms->hashLog3 = uVar2;
  (ms->window).nextSrc = (BYTE *)0x0;
  (ms->window).base = (BYTE *)0x0;
  (ms->window).dictBase = (BYTE *)0x0;
  (ms->window).dictLimit = 0;
  (ms->window).lowLimit = 0;
  ZSTD_invalidateMatchState(ms);
  if ((forCCtx != 0) && (cParams->strategy - ZSTD_btopt < 2)) {
    (ms->opt).litFreq = (U32 *)ptr;
    (ms->opt).litLengthFreq = (U32 *)((long)ptr + 0x400);
    (ms->opt).matchLengthFreq = (U32 *)((long)ptr + 0x490);
    (ms->opt).offCodeFreq = (U32 *)((long)ptr + 0x564);
    (ms->opt).matchTable = (ZSTD_match_t *)((long)ptr + 0x5e4);
    (ms->opt).priceTable = (ZSTD_optimal_t *)((long)ptr + 0x85ec);
    ptr = (void *)((long)ptr + 0x24608);
  }
  if (crp != ZSTDcrp_noMemset) {
    memset(ptr,0,(local_40 + lVar3 + lVar4) * 4);
  }
  ms->hashTable = (U32 *)ptr;
  pUVar1 = (U32 *)((long)ptr + lVar3 * 4);
  ms->chainTable = pUVar1;
  ms->hashTable3 = pUVar1 + local_40;
  return pUVar1 + local_40 + lVar4;
}

Assistant:

static void*
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      void* ptr,
                const ZSTD_compressionParameters* cParams,
                      ZSTD_compResetPolicy_e const crp, U32 const forCCtx)
{
    size_t const chainSize = (cParams->strategy == ZSTD_fast) ? 0 : ((size_t)1 << cParams->chainLog);
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = (forCCtx && cParams->searchLength==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = ((size_t)1) << hashLog3;
    size_t const tableSpace = (chainSize + hSize + h3Size) * sizeof(U32);

    assert(((size_t)ptr & 3) == 0);

    ms->hashLog3 = hashLog3;
    memset(&ms->window, 0, sizeof(ms->window));
    ZSTD_invalidateMatchState(ms);

    /* opt parser space */
    if (forCCtx && ((cParams->strategy == ZSTD_btopt) | (cParams->strategy == ZSTD_btultra))) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (U32*)ptr;
        ms->opt.litLengthFreq = ms->opt.litFreq + (1<<Litbits);
        ms->opt.matchLengthFreq = ms->opt.litLengthFreq + (MaxLL+1);
        ms->opt.offCodeFreq = ms->opt.matchLengthFreq + (MaxML+1);
        ptr = ms->opt.offCodeFreq + (MaxOff+1);
        ms->opt.matchTable = (ZSTD_match_t*)ptr;
        ptr = ms->opt.matchTable + ZSTD_OPT_NUM+1;
        ms->opt.priceTable = (ZSTD_optimal_t*)ptr;
        ptr = ms->opt.priceTable + ZSTD_OPT_NUM+1;
    }

    /* table Space */
    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_noMemset);
    assert(((size_t)ptr & 3) == 0);  /* ensure ptr is properly aligned */
    if (crp!=ZSTDcrp_noMemset) memset(ptr, 0, tableSpace);   /* reset tables only */
    ms->hashTable = (U32*)(ptr);
    ms->chainTable = ms->hashTable + hSize;
    ms->hashTable3 = ms->chainTable + chainSize;
    ptr = ms->hashTable3 + h3Size;

    assert(((size_t)ptr & 3) == 0);
    return ptr;
}